

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
* __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::
Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::iterator::operator->(iterator *this)

{
  int iVar1;
  int iVar2;
  AssertionFailure *this_00;
  BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if (-1 < (in_RDI->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
           index_) {
    iVar1 = (in_RDI->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
            index_;
    iVar2 = BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::num_items((BasicProblem<mp::BasicProblemParams<int>_> *)0x13a2de);
    if (iVar1 < iVar2) {
      return in_RDI;
    }
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,in_stack_ffffffffffffffc8);
  __cxa_throw(this_00,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
}

Assistant:

const T *operator->() const {
        MP_ASSERT(0 <= item_.index_ &&
                  item_.index_ < T::num_items(*item_.problem_),
                  "invalid access");
        return &item_;
      }